

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::IsCooperativeMatrixAccType(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  Instruction *pIVar2;
  uint64_t matrixUse;
  uint64_t local_20;
  
  pIVar2 = FindDef(this,id);
  if ((pIVar2 == (Instruction *)0x0) || ((pIVar2->inst_).opcode != 0x1168)) {
    bVar1 = false;
  }
  else {
    pIVar2 = FindDef(this,id);
    local_20 = 0;
    bVar1 = EvalConstantValUint64
                      (this,(pIVar2->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[6],&local_20);
    bVar1 = local_20 == 2 && bVar1;
  }
  return bVar1;
}

Assistant:

bool ValidationState_t::IsCooperativeMatrixAccType(uint32_t id) const {
  if (!IsCooperativeMatrixKHRType(id)) return false;
  const Instruction* inst = FindDef(id);
  uint64_t matrixUse = 0;
  if (EvalConstantValUint64(inst->word(6), &matrixUse)) {
    return matrixUse == static_cast<uint64_t>(
                            spv::CooperativeMatrixUse::MatrixAccumulatorKHR);
  }
  return false;
}